

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O1

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator=
          (TPZFYsmpMatrix<std::complex<float>_> *this,TPZVerySparseMatrix<std::complex<float>_> *cp)

{
  size_t sVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar10 = (cp->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  sVar1 = (cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (*(this->fJA)._vptr_TPZVec[3])(&this->fJA,sVar1);
  (*(this->fA)._vptr_TPZVec[3])(&this->fA,sVar1);
  (*(this->fIA)._vptr_TPZVec[3])(&this->fIA,lVar10 + 1);
  *(this->fIA).fStore = 0;
  p_Var5 = (cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(cp->fExtraSparseData)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 == p_Var11) {
    uVar7 = 0;
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar7 = 0;
    do {
      auVar4 = _DAT_014f8350;
      auVar3 = _DAT_014f8340;
      uVar6 = *(ulong *)(p_Var5 + 1);
      if (uVar6 - uVar7 != 0) {
        if ((long)(uVar7 + 1) < (long)uVar6) {
          plVar2 = (this->fIA).fStore;
          lVar9 = ~uVar7 + uVar6 + -1;
          auVar16._8_4_ = (int)lVar9;
          auVar16._0_8_ = lVar9;
          auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar16 = auVar16 ^ _DAT_014f8350;
          uVar8 = 0;
          do {
            auVar14._8_4_ = (int)uVar8;
            auVar14._0_8_ = uVar8;
            auVar14._12_4_ = (int)(uVar8 >> 0x20);
            auVar14 = (auVar14 | auVar3) ^ auVar4;
            if ((bool)(~(auVar16._4_4_ < auVar14._4_4_ ||
                        auVar16._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar16._4_4_) & 1)) {
              plVar2[uVar7 + uVar8 + 1] = lVar12;
            }
            if (auVar14._12_4_ <= auVar16._12_4_ &&
                (auVar14._8_4_ <= auVar16._8_4_ || auVar14._12_4_ != auVar16._12_4_)) {
              plVar2[uVar7 + uVar8 + 2] = lVar12;
            }
            uVar8 = uVar8 + 2;
          } while ((uVar6 - uVar7 & 0xfffffffffffffffe) != uVar8);
        }
        (this->fIA).fStore[uVar6] = lVar12;
        uVar7 = uVar6;
      }
      (this->fJA).fStore[lVar12] = (long)p_Var5[1]._M_parent;
      (this->fA).fStore[lVar12]._M_value = (_ComplexT)p_Var5[1]._M_left;
      lVar12 = lVar12 + 1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var11);
  }
  auVar4 = _DAT_014f8350;
  auVar3 = _DAT_014f8340;
  lVar9 = lVar10 - uVar7;
  if (lVar9 != 0 && (long)uVar7 <= lVar10) {
    plVar2 = (this->fIA).fStore;
    lVar10 = lVar9 + -1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar6 = 0;
    auVar13 = auVar13 ^ _DAT_014f8350;
    do {
      auVar15._8_4_ = (int)uVar6;
      auVar15._0_8_ = uVar6;
      auVar15._12_4_ = (int)(uVar6 >> 0x20);
      auVar16 = (auVar15 | auVar3) ^ auVar4;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        plVar2[uVar7 + uVar6 + 1] = lVar12;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        plVar2[uVar7 + uVar6 + 2] = lVar12;
      }
      uVar6 = uVar6 + 2;
    } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  return this;
}

Assistant:

TPZFYsmpMatrix<TVar> &TPZFYsmpMatrix<TVar>::operator=(const TPZVerySparseMatrix<TVar> &cp)
{
	// Deletes everything associated with a TPZFYsmpMatrix
	int64_t nrows = cp.Rows();
	
	int64_t count = 0, c = 0, r = 0;
	
	count = cp.fExtraSparseData.size();
	fJA.resize(count);
    fA.resize(count);
    fIA.resize(nrows+1);
	fIA[0] = 0;
	
	typename map< pair<int64_t,int64_t>, TVar>::const_iterator it;
	c = 0;
	r = 0;
	for(it=cp.fExtraSparseData.begin(); it!= cp.fExtraSparseData.end(); it++)
	{
		int64_t row = it->first.first;
		if(r != row)
		{
			r++;
			while(r < row) 
			{
				fIA[r] = c;
				r++;
			}
			fIA[row] = c;
			r = row;
		}
		int64_t col = it->first.second;
		fJA[c] = col;
		TVar val = it->second;
		fA[c] = val;
		c++;
	}
	r++;
	while(r<=nrows)
	{
		fIA[r] = c;
		r++;
	}
	return *this;
}